

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O2

void __thiscall level_mesh::restore_game_materials(level_mesh *this,xr_cform *cform)

{
  vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_> *this_00;
  uint uVar1;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  pointer p_Var5;
  pointer pbVar6;
  uint32_t uVar7;
  pointer pbVar8;
  long lVar9;
  uint32_t *cf2m;
  _vector3<float> *__x;
  uint ghost;
  int iVar10;
  pointer pbVar11;
  uint uVar12;
  pointer pcVar13;
  ulong uVar14;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_c8;
  uint32_t *local_b8;
  pointer local_b0;
  long local_a8;
  pointer local_a0;
  b_face_vec *local_98;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *local_90;
  pointer local_88;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *local_80;
  pointer local_78;
  b_face face_template;
  
  cf2m = remap_cform_verts(this,cform);
  match_edges_faces(this,cform,cf2m);
  propagate_gamemtls(this);
  xray_re::msg("restoring fake colliders");
  xray_re::xr_mesh_builder::b_face::b_face(&face_template);
  local_90 = &(this->super_xr_mesh_builder).m_normals;
  local_b0 = (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (long)(this->super_xr_mesh_builder).m_normals.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_xr_mesh_builder).m_normals.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_98 = &(this->super_xr_mesh_builder).m_faces;
  local_a0 = (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = (cform->m_vertices).
             super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
  pcVar13 = (cform->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (cform->m_faces).
             super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_80 = &(this->super_xr_mesh_builder).super_xr_mesh.m_points;
  local_b8 = cf2m;
  do {
    lVar9 = local_a8;
    if (pcVar13 == local_88) {
      uVar14 = local_a8 / 0xc;
      operator_delete__(cf2m);
      pbVar11 = local_a0;
      pbVar8 = local_b0;
      if (lVar9 != (long)(this->super_xr_mesh_builder).m_normals.
                         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_xr_mesh_builder).m_normals.
                         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) {
        xray_re::xr_mesh_builder::remove_back_faces(&this->super_xr_mesh_builder,0.001);
        this_00 = &(this->super_xr_mesh_builder).m_texcoords;
        p_Var4 = (this->super_xr_mesh_builder).m_texcoords.
                 super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        p_Var5 = (this->super_xr_mesh_builder).m_texcoords.
                 super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_c8._0_8_ = 0;
        std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::push_back
                  (this_00,(value_type *)&local_c8.field_0);
        local_c8._0_8_ = 0x3f80000000000000;
        std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::push_back
                  (this_00,(value_type *)&local_c8.field_0);
        local_c8._0_8_ = 0x3f800000;
        std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::push_back
                  (this_00,(value_type *)&local_c8.field_0);
        pbVar6 = (this->super_xr_mesh_builder).m_faces.
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar7 = (uint32_t)((ulong)((long)p_Var4 - (long)p_Var5) >> 3);
        for (pbVar11 = (pointer)((long)pbVar11 +
                                ((long)(this->super_xr_mesh_builder).m_faces.
                                       super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)pbVar8));
            pbVar11 != pbVar6; pbVar11 = pbVar11 + 1) {
          if (uVar14 <= (pbVar11->field_0).field_0.n[0]) {
            (pbVar11->field_0).field_0.tc[0] = uVar7;
            (pbVar11->field_0).field_0.tc[1] = uVar7 + 1;
            (pbVar11->field_0).field_0.tc[2] = uVar7 + 2;
          }
        }
      }
      return;
    }
    iVar10 = 0;
    for (uVar14 = 2; uVar14 != 0xffffffffffffffff; uVar14 = uVar14 - 1) {
      uVar1 = *(uint *)((long)&pcVar13->field_0 + (uVar14 & 0xffffffff) * 4);
      uVar12 = cf2m[uVar1];
      if (uVar12 == 0xffffffff) {
        p_Var2 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        p_Var3 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
                  (local_80,&local_78[uVar1].p);
        uVar12 = (uint)(((long)p_Var2 - (long)p_Var3) / 0xc);
        local_b8[uVar1] = uVar12 | 0x80000000;
        cf2m = local_b8;
LAB_0012e0f0:
        iVar10 = iVar10 + 1;
      }
      else if ((int)uVar12 < 0) {
        uVar12 = uVar12 & 0x7fffffff;
        goto LAB_0012e0f0;
      }
      face_template.field_0.__refs[uVar14 & 0xffffffff] = uVar12;
    }
    if (iVar10 != 0) {
      face_template.field_0.field_0.tc[2] = 0;
      face_template.field_0._24_8_ = 0;
      face_template.field_0.field_0.n[0] =
           (uint32_t)
           (((long)(this->super_xr_mesh_builder).m_normals.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_xr_mesh_builder).m_normals.
                  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      face_template.sector = *(uint16_t *)((long)&pcVar13->field_1 + 2);
      face_template.field_1.field_1.surf_idx = 0;
      face_template.field_1.field_1.sgroup._0_2_ = *(ushort *)&pcVar13->field_1 & 0x3fff;
      face_template.field_1.field_1.sgroup._2_2_ = 0x11;
      face_template.field_0.field_0.n[1] = face_template.field_0.field_0.n[0];
      face_template.field_0.field_0.n[2] = face_template.field_0.field_0.n[0];
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      push_back(local_98,&face_template);
      local_c8.field_0.z = 0.0;
      local_c8._0_8_ = 0;
      p_Var2 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = xray_re::_vector3<float>::calc_normal
                      ((_vector3<float> *)&local_c8.field_0,
                       p_Var2 + face_template.field_0.field_0.v[0],
                       p_Var2 + face_template.field_0.field_0.v[1],
                       p_Var2 + face_template.field_0.field_0.v[2]);
      std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
                (local_90,__x);
      cf2m = local_b8;
    }
    pcVar13 = pcVar13 + 1;
  } while( true );
}

Assistant:

void level_mesh::restore_game_materials(const xr_cform& cform)
{
	uint32_t* cf2m = remap_cform_verts(cform);
	match_edges_faces(cform, cf2m);
	propagate_gamemtls();

	msg("restoring fake colliders");
	b_face face_template;
	size_t num_normals = m_normals.size(), num_faces = m_faces.size();
	const cf_vertex* verts = &cform.vertices()[0];
	for (cf_face_vec_cit it = cform.faces().begin(), end = cform.faces().end(); it != end; ++it) {
		unsigned ghost = 0;
		for (uint32_t i = 3, vx; i != 0;) {
			const uint32_t VF_SHARED = 0x80000000;
			uint32_t vxm = cf2m[vx = it->v[--i]];
			if (vxm == BAD_IDX) {
				vxm = uint32_t(m_points.size() & UINT32_MAX);
				m_points.push_back(verts[vx].p);
				cf2m[vx] = vxm | VF_SHARED;
				++ghost;
			} else if (vxm & VF_SHARED) {
				vxm &= ~VF_SHARED;
				++ghost;
			}
			face_template.v[i] = vxm;
		}
		if (ghost) {
			face_template.tc0 = face_template.tc1 = face_template.tc2 = 0;
			face_template.n0 = face_template.n1 = face_template.n2 =
					uint32_t(m_normals.size() & UINT32_MAX);
			face_template.sector = it->sector;
			face_template.surface.set(0, 0, it->material, RSF_COLLISION|RSF_AUTOMATIC);
			m_faces.push_back(face_template);
			m_normals.push_back(fvector3().calc_normal(m_points[face_template.v0],
					m_points[face_template.v1], m_points[face_template.v2]));
		}
	}
	delete[] cf2m;
	if (num_normals != m_normals.size()) {
		remove_back_faces(1e-3f);

		uint32_t tc_base = uint32_t(m_texcoords.size() & UINT32_MAX);
		m_texcoords.push_back(fvector2().set(0.f, 0.f));
		m_texcoords.push_back(fvector2().set(0.f, 1.f));
		m_texcoords.push_back(fvector2().set(1.f, 0.f));

		for (b_face_vec_it it = m_faces.begin() + num_faces, end = m_faces.end(); it != end; ++it) {
			if (it->n0 >= num_normals) {
				it->tc0 = tc_base;
				it->tc1 = tc_base + 1;
				it->tc2 = tc_base + 2;
			}
		}
	}
}